

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O0

PmError alsa_use_queue(void)

{
  undefined1 *puVar1;
  long lVar2;
  size_t __n;
  undefined8 uStack_30;
  undefined1 auStack_28 [8];
  undefined1 *local_20;
  undefined1 *local_18;
  snd_seq_queue_tempo_t *tempo;
  
  if (queue_used == 0) {
    uStack_30 = 0x104531;
    queue = snd_seq_alloc_queue(seq);
    if (queue < 0) {
      pm_hosterror = queue;
      return pmHostError;
    }
    uStack_30 = 0x104562;
    lVar2 = snd_seq_queue_tempo_sizeof();
    lVar2 = -(lVar2 + 0xfU & 0xfffffffffffffff0);
    local_20 = auStack_28 + lVar2;
    local_18 = local_20;
    *(undefined8 *)(auStack_28 + lVar2 + -8) = 0x104587;
    __n = snd_seq_queue_tempo_sizeof();
    puVar1 = local_20;
    *(undefined8 *)(auStack_28 + lVar2 + -8) = 0x104595;
    memset(puVar1,0,__n);
    puVar1 = local_18;
    *(undefined8 *)(auStack_28 + lVar2 + -8) = 0x1045a3;
    snd_seq_queue_tempo_set_tempo(puVar1,480000);
    puVar1 = local_18;
    *(undefined8 *)(auStack_28 + lVar2 + -8) = 0x1045b1;
    snd_seq_queue_tempo_set_ppq(puVar1,0x1e0);
    puVar1 = local_18;
    *(undefined8 *)(auStack_28 + lVar2 + -8) = 0x1045c7;
    pm_hosterror = snd_seq_set_queue_tempo(seq,queue,puVar1);
    if (pm_hosterror < 0) {
      return pmHostError;
    }
    *(undefined8 *)(auStack_28 + lVar2 + -8) = 0x104605;
    snd_seq_control_queue(seq,queue,0x1e,0,0);
    *(undefined8 *)(auStack_28 + lVar2 + -8) = 0x104611;
    snd_seq_drain_output(seq);
  }
  queue_used = queue_used + 1;
  return pmNoData;
}

Assistant:

static PmError alsa_use_queue(void)
{
    if (queue_used == 0) {
        snd_seq_queue_tempo_t *tempo;

        queue = snd_seq_alloc_queue(seq);
        if (queue < 0) {
            pm_hosterror = queue;
            return pmHostError;
        }
        snd_seq_queue_tempo_alloca(&tempo);
        snd_seq_queue_tempo_set_tempo(tempo, 480000);
        snd_seq_queue_tempo_set_ppq(tempo, 480);
        pm_hosterror = snd_seq_set_queue_tempo(seq, queue, tempo);
        if (pm_hosterror < 0)
            return pmHostError;

        snd_seq_start_queue(seq, queue, NULL);
        snd_seq_drain_output(seq);
    }
    ++queue_used;
    return pmNoError;
}